

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparisontesthelper.cpp
# Opt level: O0

QByteArray *
QTestPrivate::formatTypeWithCRefImpl(QMetaType type,bool isConst,bool isRef,bool isRvalueRef)

{
  char *pcVar1;
  byte in_CL;
  byte in_DL;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *res;
  char *in_stack_ffffffffffffffb8;
  QByteArray *this;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  pcVar1 = QMetaType::name(&local_10);
  QByteArray::QByteArray(in_RDI,pcVar1,-1);
  if ((in_DL & 1) != 0) {
    QByteArray::append(this,in_stack_ffffffffffffffb8);
  }
  if ((in_CL & 1) != 0) {
    QByteArray::append(this,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QByteArray formatTypeWithCRefImpl(QMetaType type, bool isConst, bool isRef, bool isRvalueRef)
{
    QByteArray res(type.name());
    if (isConst)
        res.append(" const");
    if (isRef)
        res.append(isRvalueRef ? " &&" : " &");
    return res;
}